

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

void __thiscall
QItemSelectionModelPrivate::columnsAboutToBeInserted
          (QItemSelectionModelPrivate *this,QModelIndex *parent,int start,int end)

{
  QPersistentModelIndex *this_00;
  QItemSelection *this_01;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  iterator abegin;
  iterator iVar5;
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_02;
  long in_FS_OFFSET;
  QModelIndex local_e0;
  QItemSelectionRange local_c8;
  QModelIndex local_b8;
  QItemSelectionRange local_98;
  QModelIndex local_88;
  QModelIndex local_70;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &this->ranges;
  QItemSelection::merge
            (this_01,&this->currentSelection,
             (SelectionFlags)
             (this->currentCommand).super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>
             .super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  if ((this->currentSelection).super_QList<QItemSelectionRange>.d.size != 0) {
    QList<QItemSelectionRange>::clear(&(this->currentSelection).super_QList<QItemSelectionRange>);
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (QItemSelectionRange *)0x0;
  local_58.size = 0;
  abegin = QList<QItemSelectionRange>::begin(&this_01->super_QList<QItemSelectionRange>);
  this_02 = &this->model;
  do {
    while( true ) {
      iVar5 = QList<QItemSelectionRange>::end(&this_01->super_QList<QItemSelectionRange>);
      if (abegin.i == iVar5.i) {
        QtPrivate::QCommonArrayOps<QItemSelectionRange>::growAppend
                  ((QCommonArrayOps<QItemSelectionRange> *)this_01,local_58.ptr,
                   local_58.ptr + local_58.size);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
        __stack_chk_fail();
      }
      QPersistentModelIndex::parent(&local_70,&(abegin.i)->tl);
      bVar2 = QItemSelectionRange::isValid(abegin.i);
      if ((((bVar2) && (local_70.r == parent->r)) && (local_70.c == parent->c)) &&
         ((local_70.i == parent->i && (local_70.m.ptr == (parent->m).ptr)))) break;
LAB_0046add5:
      abegin.i = abegin.i + 1;
    }
    iVar3 = QPersistentModelIndex::column(&(abegin.i)->tl);
    if (start <= iVar3) goto LAB_0046add5;
    this_00 = &(abegin.i)->br;
    iVar3 = QPersistentModelIndex::column(this_00);
    if (iVar3 < start) goto LAB_0046add5;
    local_88.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_02);
    pQVar1 = (this_02->super_QPropertyData<QAbstractItemModel_*>).val;
    uVar4 = QPersistentModelIndex::row(this_00);
    (*(pQVar1->super_QObject)._vptr_QObject[0xc])
              (&local_88,pQVar1,(ulong)uVar4,(ulong)(start - 1),&local_70);
    local_98.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&(abegin.i)->tl);
    QItemSelectionRange::QItemSelectionRange(&local_98,&local_b8,&local_88);
    local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_02);
    pQVar1 = (this_02->super_QPropertyData<QAbstractItemModel_*>).val;
    uVar4 = QPersistentModelIndex::row(&(abegin.i)->tl);
    (*(pQVar1->super_QObject)._vptr_QObject[0xc])
              (&local_b8,pQVar1,(ulong)uVar4,(ulong)(uint)start,&local_70);
    local_c8.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex(this_00);
    QItemSelectionRange::QItemSelectionRange(&local_c8,&local_b8,&local_e0);
    abegin = QList<QItemSelectionRange>::erase
                       (&this_01->super_QList<QItemSelectionRange>,abegin.i,abegin.i + 1);
    QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
              ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,&local_98);
    QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
    QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
              ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,&local_c8);
    QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
    QPersistentModelIndex::~QPersistentModelIndex(&local_c8.br);
    QPersistentModelIndex::~QPersistentModelIndex(&local_c8.tl);
    QPersistentModelIndex::~QPersistentModelIndex(&local_98.br);
    QPersistentModelIndex::~QPersistentModelIndex(&local_98.tl);
  } while( true );
}

Assistant:

void QItemSelectionModelPrivate::columnsAboutToBeInserted(const QModelIndex &parent,
                                                             int start, int end)
{
    Q_UNUSED(end);
    finalize();
    QList<QItemSelectionRange> split;
    QList<QItemSelectionRange>::iterator it = ranges.begin();
    for (; it != ranges.end(); ) {
        const QModelIndex &itParent = it->parent();
        if ((*it).isValid() && itParent == parent
            && (*it).left() < start && (*it).right() >= start) {
            QModelIndex bottomMiddle = model->index((*it).bottom(), start - 1, itParent);
            QItemSelectionRange left((*it).topLeft(), bottomMiddle);
            QModelIndex topMiddle = model->index((*it).top(), start, itParent);
            QItemSelectionRange right(topMiddle, (*it).bottomRight());
            it = ranges.erase(it);
            split.append(left);
            split.append(right);
        } else {
            ++it;
        }
    }
    ranges += split;
}